

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O1

int test(char *URL)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timeval tVar7;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  lVar4 = curl_easy_init();
  iVar3 = 0;
  if (lVar4 == 0) {
    test_cold_1();
    iVar3 = 0x7c;
  }
  lVar5 = 0;
  if (lVar4 != 0) {
    iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
    iVar3 = 0;
    if (iVar2 != 0) {
      test_cold_2();
      iVar3 = iVar2;
    }
    if (iVar3 == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x2a,1);
      iVar3 = 0;
      if (iVar2 != 0) {
        test_cold_3();
        iVar3 = iVar2;
      }
      lVar5 = 0;
      if (iVar3 != 0) goto LAB_0010264e;
      iVar2 = curl_easy_setopt(lVar4,0x40,0);
      iVar3 = 0;
      if (iVar2 != 0) {
        test_cold_4();
        iVar3 = iVar2;
      }
      if (iVar3 == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x51,0);
        iVar3 = 0;
        if (iVar2 != 0) {
          test_cold_5();
          iVar3 = iVar2;
        }
        if (iVar3 == 0) {
          lVar5 = curl_multi_init();
          if (lVar5 == 0) {
            test_cold_6();
            iVar3 = 0x7b;
          }
          else {
            iVar2 = curl_multi_add_handle(lVar5,lVar4);
            iVar3 = 0;
            if (iVar2 != 0) {
              test_cold_7();
              iVar3 = iVar2;
            }
            if (iVar3 == 0) {
              iVar3 = curl_multi_perform(lVar5,&local_1d0);
              if (iVar3 == 0) {
                iVar3 = 0;
                if (local_1d0 < 0) {
                  fprintf(_stderr,
                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                          ,0x45);
                  iVar3 = 0x7a;
                }
              }
              else {
                test_cold_8();
              }
              if (iVar3 == 0) {
                tVar7 = tutil_tvnow();
                lVar6 = tutil_tvdiff(tVar7,tv_test_start);
                iVar3 = 0;
                if (lVar6 < 0xea61) {
                  if (local_1d0 != 0) {
                    iVar2 = 0;
                    do {
                      local_1cc = -99;
                      local_b8.__fds_bits[0] = 0;
                      local_b8.__fds_bits[1] = 0;
                      local_b8.__fds_bits[2] = 0;
                      local_b8.__fds_bits[3] = 0;
                      local_b8.__fds_bits[4] = 0;
                      local_b8.__fds_bits[5] = 0;
                      local_b8.__fds_bits[6] = 0;
                      local_b8.__fds_bits[7] = 0;
                      local_b8.__fds_bits[8] = 0;
                      local_b8.__fds_bits[9] = 0;
                      local_b8.__fds_bits[10] = 0;
                      local_b8.__fds_bits[0xb] = 0;
                      local_b8.__fds_bits[0xc] = 0;
                      local_b8.__fds_bits[0xd] = 0;
                      local_b8.__fds_bits[0xe] = 0;
                      local_b8.__fds_bits[0xf] = 0;
                      local_138.__fds_bits[0] = 0;
                      local_138.__fds_bits[1] = 0;
                      local_138.__fds_bits[2] = 0;
                      local_138.__fds_bits[3] = 0;
                      local_138.__fds_bits[4] = 0;
                      local_138.__fds_bits[5] = 0;
                      local_138.__fds_bits[6] = 0;
                      local_138.__fds_bits[7] = 0;
                      local_138.__fds_bits[8] = 0;
                      local_138.__fds_bits[9] = 0;
                      local_138.__fds_bits[10] = 0;
                      local_138.__fds_bits[0xb] = 0;
                      local_138.__fds_bits[0xc] = 0;
                      local_138.__fds_bits[0xd] = 0;
                      local_138.__fds_bits[0xe] = 0;
                      local_138.__fds_bits[0xf] = 0;
                      local_1b8.__fds_bits[0xe] = 0;
                      local_1b8.__fds_bits[0xf] = 0;
                      local_1b8.__fds_bits[0xc] = 0;
                      local_1b8.__fds_bits[0xd] = 0;
                      local_1b8.__fds_bits[10] = 0;
                      local_1b8.__fds_bits[0xb] = 0;
                      local_1b8.__fds_bits[8] = 0;
                      local_1b8.__fds_bits[9] = 0;
                      local_1b8.__fds_bits[6] = 0;
                      local_1b8.__fds_bits[7] = 0;
                      local_1b8.__fds_bits[4] = 0;
                      local_1b8.__fds_bits[5] = 0;
                      local_1b8.__fds_bits[2] = 0;
                      local_1b8.__fds_bits[3] = 0;
                      local_1b8.__fds_bits[0] = 0;
                      local_1b8.__fds_bits[1] = 0;
                      local_1c8.tv_sec = 1;
                      local_1c8.tv_usec = 0;
                      iVar3 = curl_multi_fdset(lVar5,&local_b8,&local_138,&local_1b8,&local_1cc);
                      if (iVar3 == 0) {
                        iVar3 = iVar2;
                        if (local_1cc < -1) {
                          fprintf(_stderr,
                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                  ,0x5a);
                          iVar3 = 0x7a;
                        }
                      }
                      else {
                        test_cold_10();
                      }
                      bVar1 = true;
                      if (iVar3 == 0) {
                        iVar3 = select_wrapper(local_1cc + 1,&local_b8,&local_138,&local_1b8,
                                               &local_1c8);
                        if (iVar3 == -1) {
                          test_cold_11();
                          iVar3 = 0x79;
                        }
                        else {
                          tVar7 = tutil_tvnow();
                          lVar6 = tutil_tvdiff(tVar7,tv_test_start);
                          if (lVar6 < 0xea61) {
                            iVar3 = curl_multi_perform(lVar5,&local_1d0);
                            if (iVar3 == 0) {
                              iVar3 = 0;
                              if (local_1d0 < 0) {
                                fprintf(_stderr,
                                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                        ,99);
                                iVar3 = 0x7a;
                              }
                            }
                            else {
                              test_cold_13();
                            }
                            if (iVar3 == 0) {
                              tVar7 = tutil_tvnow();
                              lVar6 = tutil_tvdiff(tVar7,tv_test_start);
                              iVar3 = 0;
                              bVar1 = 60000 < lVar6;
                              if (60000 < lVar6) {
                                test_cold_14();
                                iVar3 = 0x7d;
                              }
                            }
                          }
                          else {
                            test_cold_12();
                            iVar3 = 0x7d;
                          }
                        }
                      }
                    } while ((!bVar1) && (iVar2 = iVar3, local_1d0 != 0));
                  }
                }
                else {
                  test_cold_9();
                  iVar3 = 0x7d;
                }
              }
            }
          }
          goto LAB_0010264e;
        }
      }
    }
    lVar5 = 0;
  }
LAB_0010264e:
  curl_multi_cleanup(lVar5);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}